

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O2

void __thiscall
TransactionContext_VerifyErrorCheck_Test::TestBody(TransactionContext_VerifyErrorCheck_Test *this)

{
  Script *this_00;
  bool bVar1;
  long lVar2;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Privkey> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  initializer_list<cfd::SignParameter> __l_02;
  allocator_type local_2460 [16];
  OutPoint outpoint3;
  SignParameter sign2;
  SigHashType sighash_type;
  ByteData256 sighash3;
  OutPoint outpoint2;
  SignParameter sign1;
  ByteData signature2;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkeys;
  Script scriptSig;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures3;
  ByteData signature1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  SigHashType local_221c;
  SigHashType local_2210;
  SigHashType local_2204;
  SigHashType local_21f8;
  SigHashType local_21ec;
  AddressFactory factory;
  OutPoint outpoint1;
  ByteData tx;
  TransactionContext txc;
  Address address;
  Address address2;
  AssertionResult gtest_ar;
  undefined1 local_1db8 [24];
  undefined1 local_1da0 [72];
  SignParameter local_1d58 [9];
  UtxoData local_18e0;
  UtxoData local_13f0;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  
  cfd::AddressFactory::AddressFactory(&factory,kRegtest);
  cfd::UtxoData::UtxoData(&utxo1);
  utxo1.block_height = 0;
  utxo1.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo2,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&utxo3);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&utxo2);
  cfd::core::Txid::operator=(&utxo1.txid,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  utxo1.vout = 0;
  std::__cxx11::string::string
            ((string *)&utxo2,"2NDdj5X7X7qS9LYZJPdD8tY4NZ7CZFR3Tbi",(allocator *)&utxo3);
  cfd::AddressFactory::GetAddress((Address *)&gtest_ar,&factory,(string *)&utxo2);
  cfd::core::Address::operator=(&utxo1.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  cfd::core::Address::GetLockingScript((Script *)&gtest_ar,&utxo1.address);
  cfd::core::Script::operator=(&utxo1.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::assign((char *)&utxo1.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,10000000);
  utxo1.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo1.amount.amount_ = gtest_ar._0_8_;
  utxo1.address_type = kP2shP2wpkhAddress;
  cfd::UtxoData::UtxoData(&utxo2);
  utxo2.block_height = 0;
  utxo2.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo3,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             (allocator *)&address);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&utxo3);
  cfd::core::Txid::operator=(&utxo2.txid,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo3);
  utxo2.vout = 2;
  std::__cxx11::string::string
            ((string *)&utxo3,"bcrt1qeh098dzrl5d5n50duth76uhv9mr9fq9309ymtn",(allocator *)&address);
  cfd::AddressFactory::GetAddress((Address *)&gtest_ar,&factory,(string *)&utxo3);
  cfd::core::Address::operator=(&utxo2.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo3);
  cfd::core::Address::GetLockingScript((Script *)&gtest_ar,&utxo2.address);
  cfd::core::Script::operator=(&utxo2.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::assign((char *)&utxo2.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,10000);
  utxo2.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo2.amount.amount_ = gtest_ar._0_8_;
  utxo2.address_type = kP2wpkhAddress;
  std::__cxx11::string::string
            ((string *)&utxo3,"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",
             (allocator *)&txc);
  cfd::core::Pubkey::Pubkey((Pubkey *)&gtest_ar,(string *)&utxo3);
  std::__cxx11::string::string
            ((string *)&address,"020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"
             ,(allocator *)&sign2);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1db8,(string *)&address);
  std::__cxx11::string::string
            ((string *)&address2,
             "03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae",
             (allocator *)&sign1);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1da0,(string *)&address2);
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&pubkeys,__l,(allocator_type *)&scriptSig);
  lVar2 = 0x30;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               (&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  std::__cxx11::string::~string((string *)&address2);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::~string((string *)&utxo3);
  std::__cxx11::string::string
            ((string *)&utxo3,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
             (allocator *)&txc);
  cfd::core::Privkey::FromWif((Privkey *)&gtest_ar,(string *)&utxo3,kTestnet,true);
  std::__cxx11::string::string
            ((string *)&address,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt",
             (allocator *)&sign2);
  cfd::core::Privkey::FromWif((Privkey *)(local_1db8 + 8),(string *)&address,kTestnet,true);
  std::__cxx11::string::string
            ((string *)&address2,"cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9",
             (allocator *)&sign1);
  cfd::core::Privkey::FromWif((Privkey *)(local_1da0 + 0x10),(string *)&address2,kTestnet,true);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&gtest_ar;
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            (&privkeys,__l_00,(allocator_type *)&scriptSig);
  lVar2 = 0x40;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               (&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::~string((string *)&address2);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::~string((string *)&utxo3);
  cfd::UtxoData::UtxoData(&utxo3);
  utxo3.block_height = 0;
  utxo3.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&address,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             (allocator *)&address2);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&address);
  cfd::core::Txid::operator=(&utxo3.txid,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  utxo3.vout = 1;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript((Script *)&gtest_ar,2,&pubkeys,true);
  this_00 = &utxo3.redeem_script;
  cfd::core::Script::operator=(this_00,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  cfd::AddressFactory::CreateP2shAddress((Address *)&gtest_ar,&factory,this_00);
  cfd::core::Address::operator=(&utxo3.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  cfd::core::Address::GetLockingScript((Script *)&gtest_ar,&utxo3.address);
  cfd::core::Script::operator=(&utxo3.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::assign((char *)&utxo3.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,180000);
  utxo3.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo3.amount.amount_ = gtest_ar._0_8_;
  utxo3.address_type = kP2wshAddress;
  std::__cxx11::string::string
            ((string *)&gtest_ar,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo",(allocator *)&address2);
  cfd::core::Address::Address(&address,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu",(allocator *)&txc);
  cfd::core::Address::Address(&address2,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::TransactionContext::TransactionContext(&txc,2,0);
  cfd::UtxoData::UtxoData((UtxoData *)&gtest_ar,&utxo1);
  cfd::UtxoData::UtxoData(&local_18e0,&utxo2);
  cfd::UtxoData::UtxoData(&local_13f0,&utxo3);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l_01,(allocator_type *)&sign2);
  lVar2 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x4f0;
  } while (lVar2 != -0x4f0);
  cfd::core::SigHashType::SigHashType(&sighash_type);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInputs(&txc,&utxos);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x287,
               "Expected: txc.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::TransactionContext::AddTxOut(&txc,&address,&utxo1.amount);
  cfd::TransactionContext::AddTxOut(&txc,&address2,&utxo2.amount);
  cfd::core::ByteData::ByteData(&tx);
  cfd::core::OutPoint::OutPoint(&outpoint1,&utxo1.txid,utxo1.vout);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 (allocator *)&outpoint2);
      cfd::core::Pubkey::Pubkey((Pubkey *)&scriptSig,(string *)&gtest_ar);
      std::__cxx11::string::string
                ((string *)&sign1,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 (allocator *)&outpoint3);
      cfd::core::Privkey::FromWif((Privkey *)&sign2,(string *)&sign1,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_21ec);
      cfd::TransactionContext::SignWithKey
                (&txc,&outpoint1,(Pubkey *)&scriptSig,(Privkey *)&sign2,&local_21ec,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sign2);
      std::__cxx11::string::~string((string *)&sign1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x292,
               "Expected: txc.SignWithKey(outpoint1, Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  std::__cxx11::string::string
            ((string *)&sign2,"020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281",
             (allocator *)&sighash3);
  cfd::core::Pubkey::Pubkey((Pubkey *)&outpoint3,(string *)&sign2);
  cfd::core::ScriptUtil::CreateP2wpkhLockingScript((Script *)&gtest_ar,(Pubkey *)&outpoint3);
  cfd::core::Script::GetData((ByteData *)&outpoint2,(Script *)&gtest_ar);
  cfd::core::ByteData::Serialize(&sign1.data_,(ByteData *)&outpoint2);
  cfd::core::Script::Script(&scriptSig,&sign1.data_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sign1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint2);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint3);
  std::__cxx11::string::~string((string *)&sign2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::SetUnlockingScript(&txc.super_Transaction,0,&scriptSig);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x296,
               "Expected: txc.SetUnlockingScript(0, scriptSig) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::TransactionContext::Verify(&txc,&outpoint1);
  cfd::core::OutPoint::OutPoint(&outpoint2,&utxo2.txid,utxo2.vout);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,
                 "020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281",
                 (allocator *)&sighash3);
      cfd::core::Pubkey::Pubkey((Pubkey *)&outpoint3,(string *)&gtest_ar);
      std::__cxx11::string::string
                ((string *)&sign1,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt",
                 (allocator *)&signature2);
      cfd::core::Privkey::FromWif((Privkey *)&sign2,(string *)&sign1,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_21f8);
      cfd::TransactionContext::SignWithKey
                (&txc,&outpoint2,(Pubkey *)&outpoint3,(Privkey *)&sign2,&local_21f8,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sign2);
      std::__cxx11::string::~string((string *)&sign1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint3);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x2a2,
               "Expected: txc.SignWithKey(outpoint2, Pubkey(\"020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281\"), Privkey::FromWif( \"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::TransactionContext::Verify(&txc,&outpoint2);
  cfd::core::OutPoint::OutPoint(&outpoint3,&utxo3.txid,utxo3.vout);
  cfd::core::SigHashType::SigHashType(&local_2204,&sighash_type);
  cfd::TransactionContext::CreateSignatureHash
            ((ByteData *)&gtest_ar,&txc,&outpoint3,this_00,&local_2204,&utxo3.amount,kVersion0);
  cfd::core::ByteData256::ByteData256(&sighash3,(ByteData *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  cfd::core::SignatureUtil::CalculateEcSignature
            (&signature2,&sighash3,
             privkeys.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 2,true);
  cfd::core::SignatureUtil::CalculateEcSignature
            (&signature1,&sighash3,
             privkeys.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 1,true);
  cfd::core::SigHashType::SigHashType(&local_2210,&sighash_type);
  cfd::SignParameter::SignParameter(&sign2,&signature2,true,&local_2210);
  cfd::core::SigHashType::SigHashType(&local_221c,&sighash_type);
  cfd::SignParameter::SignParameter(&sign1,&signature1,true,&local_221c);
  cfd::SignParameter::SignParameter((SignParameter *)&gtest_ar,&sign2);
  cfd::SignParameter::SignParameter(local_1d58,&sign1);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&gtest_ar;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (&signatures3,__l_02,local_2460);
  lVar2 = 0x78;
  do {
    cfd::SignParameter::~SignParameter((SignParameter *)(&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x78;
  } while (lVar2 != -0x78);
  cfd::TransactionContext::AddMultisigSign(&txc,&outpoint3,&signatures3,this_00,utxo3.address_type);
  cfd::TransactionContext::Verify(&txc,&outpoint3);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&signatures3);
  cfd::SignParameter::~SignParameter(&sign1);
  cfd::SignParameter::~SignParameter(&sign2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash3);
  cfd::core::Txid::~Txid(&outpoint3.txid_);
  cfd::core::Txid::~Txid(&outpoint2.txid_);
  cfd::core::Script::~Script(&scriptSig);
  cfd::core::Txid::~Txid(&outpoint1.txid_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::TransactionContext::~TransactionContext(&txc);
  cfd::core::Address::~Address(&address2);
  cfd::core::Address::~Address(&address);
  cfd::UtxoData::~UtxoData(&utxo3);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector(&privkeys);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pubkeys);
  cfd::UtxoData::~UtxoData(&utxo2);
  cfd::UtxoData::~UtxoData(&utxo1);
  cfd::AddressFactory::~AddressFactory(&factory);
  return;
}

Assistant:

TEST(TransactionContext, VerifyErrorCheck)
{
  AddressFactory factory(NetType::kRegtest);
  // Address1 (p2sh-p2wpkh)
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  // dummy pubkey: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // dummy privkey: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.address = factory.GetAddress("2NDdj5X7X7qS9LYZJPdD8tY4NZ7CZFR3Tbi");
  utxo1.locking_script = utxo1.address.GetLockingScript();
  utxo1.descriptor = "sh(wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2shP2wpkhAddress;

  // Address2 (p2wpkh)
  // pubkey: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  // dummy pubkey: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // dummy privkey: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 2;
  utxo2.address = factory.GetAddress("bcrt1qeh098dzrl5d5n50duth76uhv9mr9fq9309ymtn");
  utxo2.locking_script = utxo2.address.GetLockingScript();
  utxo2.descriptor = "wpkh(03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)";
  utxo2.amount = Amount(int64_t{10000});
  utxo2.address_type = AddressType::kP2wpkhAddress;

  // Address3 (2 of 3 multisig)
  // pubkey1: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey1: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // pubkey2: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // privkey2: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  // pubkey3: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey3: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  std::vector<Pubkey> pubkeys = {
    Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
    Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
    Pubkey("03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae")
  };
  std::vector<Privkey> privkeys = {
    Privkey::FromWif("cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet),
    Privkey::FromWif("cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet),
    Privkey::FromWif("cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9", NetType::kTestnet)
  };
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo3.vout = 1;
  utxo3.redeem_script = ScriptUtil::CreateMultisigRedeemScript(2, pubkeys);
  utxo3.address = factory.CreateP2shAddress(utxo3.redeem_script);
  utxo3.locking_script = utxo3.address.GetLockingScript();
  utxo3.descriptor = "wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae))";
  utxo3.amount = Amount(int64_t{180000});
  utxo3.address_type = AddressType::kP2wshAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  TransactionContext txc(2, 0);
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};
  SigHashType sighash_type;

  EXPECT_NO_THROW(txc.AddInputs(utxos));
  txc.AddTxOut(address, utxo1.amount);
  txc.AddTxOut(address2, utxo2.amount);

  ByteData tx;

  // sign1
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  EXPECT_NO_THROW(txc.SignWithKey(outpoint1,
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  Script scriptSig(ScriptUtil::CreateP2wpkhLockingScript(
      Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"))
        .GetData().Serialize());
  EXPECT_NO_THROW(txc.SetUnlockingScript(0, scriptSig));
  try {
    txc.Verify(outpoint1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("p2sh-p2wpkh scriptsig unmatch.", except.what());
  }

  // sign2
  OutPoint outpoint2(utxo2.txid, utxo2.vout);
  EXPECT_NO_THROW(txc.SignWithKey(outpoint2,
      Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
      Privkey::FromWif(
          "cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet)));
  try {
    txc.Verify(outpoint2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Unmatch locking script.", except.what());
  }

  // sign3
  OutPoint outpoint3(utxo3.txid, utxo3.vout);
  ByteData256 sighash3 = ByteData256(txc.CreateSignatureHash(outpoint3,
      utxo3.redeem_script, sighash_type, utxo3.amount, WitnessVersion::kVersion0));
  ByteData signature2 = SignatureUtil::CalculateEcSignature(sighash3, privkeys[2]);
  ByteData signature1 = SignatureUtil::CalculateEcSignature(sighash3, privkeys[1]);
  SignParameter sign2(signature2, true, sighash_type);
  SignParameter sign1(signature1, true, sighash_type);
  std::vector<SignParameter> signatures3 = {sign2, sign1};
  txc.AddMultisigSign(
      outpoint3, signatures3, utxo3.redeem_script, utxo3.address_type);
  try {
    txc.Verify(outpoint3);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Signature order is incorrect.", except.what());
  }
}